

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor_state.cpp
# Opt level: O1

void __thiscall duckdb::ExpressionState::AddChild(ExpressionState *this,Expression *child_expr)

{
  ExpressionClass EVar1;
  unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
  child_state;
  pointer local_20;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&(this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &child_expr->return_type);
  ExpressionExecutor::InitializeState
            ((ExpressionExecutor *)&stack0xffffffffffffffe0,child_expr,this->root);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionState,std::default_delete<duckdb::ExpressionState>,true>>>
              *)&this->child_states,
             (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
              *)&stack0xffffffffffffffe0);
  EVar1 = (child_expr->super_BaseExpression).expression_class;
  ::std::vector<bool,_std::allocator<bool>_>::push_back
            (&(this->initialize).super_vector<bool,_std::allocator<bool>_>,
             (bool)((byte)(0x77fffffff >> (EVar1 & (BOUND_DEFAULT|BOUND_CONSTANT))) & 1 |
                   BOUND_REF < EVar1));
  if (local_20 != (pointer)0x0) {
    (**(code **)&((*local_20)->super_BaseExpression).type)();
  }
  return;
}

Assistant:

void ExpressionState::AddChild(Expression &child_expr) {
	types.push_back(child_expr.return_type);
	auto child_state = ExpressionExecutor::InitializeState(child_expr, root);
	child_states.push_back(std::move(child_state));

	auto expr_class = child_expr.GetExpressionClass();
	auto initialize_child = expr_class != ExpressionClass::BOUND_REF && expr_class != ExpressionClass::BOUND_CONSTANT &&
	                        expr_class != ExpressionClass::BOUND_PARAMETER;
	initialize.push_back(initialize_child);
}